

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Greetings.cpp
# Opt level: O3

void __thiscall
RenX_GreetingsPlugin::RenX_OnJoin::anon_class_24_3_00aaa707::operator()
          (anon_class_24_3_00aaa707 *this,string *raw_message)

{
  RenX_GreetingsPlugin *pRVar1;
  long in_RDX;
  string msg;
  long *local_40;
  undefined8 local_38;
  long local_30 [2];
  
  pRVar1 = this->this;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,raw_message,(long)&(raw_message->_M_dataplus)._M_p + in_RDX);
  RenX::sanitizeTags((string *)&local_40);
  RenX::processTags((string *)&local_40,this->server,this->player,(PlayerInfo *)0x0,
                    (BuildingInfo *)0x0);
  if (pRVar1->m_sendPrivate == true) {
    RenX::Server::sendMessage(this->server,this->player,local_38,local_40);
  }
  else {
    RenX::Server::sendMessage(this->server,local_38,local_40);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void RenX_GreetingsPlugin::RenX_OnJoin(RenX::Server &server, const RenX::PlayerInfo &player) {
	auto sendMessage = [&](const std::string& raw_message) {
		std::string msg = raw_message;

		RenX::sanitizeTags(msg);
		RenX::processTags(msg, &server, &player);

		if (m_sendPrivate)
			server.sendMessage(player, msg);
		else
			server.sendMessage(msg);
	};

	if (player.isBot == false && server.isMatchInProgress()) {
		switch (m_sendMode) {
		case 0:
			m_lastLine = rand() % m_greetingsFile.getLineCount();
			sendMessage(m_greetingsFile.getLine(m_lastLine));
			break;
		case 1:
			if (++m_lastLine == m_greetingsFile.getLineCount())
				m_lastLine = 0;
			sendMessage(m_greetingsFile.getLine(m_lastLine));
			break;
		case 2:
			for (m_lastLine = 0; m_lastLine != m_greetingsFile.getLineCount(); m_lastLine++)
				sendMessage(m_greetingsFile.getLine(m_lastLine));
			break;
		default:
			return;
		}
	}
}